

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O0

int ARKodeGetStepStats(void *arkode_mem,long *nsteps,sunrealtype *hinused,sunrealtype *hlast,
                      sunrealtype *hcur,sunrealtype *tcur)

{
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  undefined8 *in_R9;
  ARKodeMem ark_mem;
  int local_4;
  
  if (in_RDI == 0) {
    arkProcessError((ARKodeMem)0x0,-0x15,0x942,"ARKodeGetStepStats",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_io.c"
                    ,"arkode_mem = NULL illegal.");
    local_4 = -0x15;
  }
  else {
    *in_RSI = *(undefined8 *)(in_RDI + 0x310);
    *in_RDX = *(undefined8 *)(in_RDI + 0x358);
    *in_RCX = *(undefined8 *)(in_RDI + 0x370);
    *in_R8 = *(undefined8 *)(in_RDI + 0x2c0);
    *in_R9 = *(undefined8 *)(in_RDI + 0x2d0);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ARKodeGetStepStats(void* arkode_mem, long int* nsteps, sunrealtype* hinused,
                       sunrealtype* hlast, sunrealtype* hcur, sunrealtype* tcur)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  *nsteps  = ark_mem->nst;
  *hinused = ark_mem->h0u;
  *hlast   = ark_mem->hold;
  *hcur    = ark_mem->next_h;
  *tcur    = ark_mem->tcur;
  return (ARK_SUCCESS);
}